

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<long_long,QSocks5BindData*>::emplace<QSocks5BindData*const&>
          (QHash<long_long,QSocks5BindData*> *this,longlong *key,QSocks5BindData **args)

{
  Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *pDVar1;
  QSocks5BindData *pQVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<long_long,_QSocks5BindData_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QSocks5BindData **)this;
  if (pQVar2 == (QSocks5BindData *)0x0) {
    local_28.d = (Data *)0x0;
LAB_0023c72f:
    pQVar2 = (QSocks5BindData *)0x0;
LAB_0023c750:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_>::detached
                       ((Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)pQVar2);
    *(Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> **)this = pDVar1;
  }
  else {
    if (*(uint *)&(pQVar2->super_QSocks5Data).controlSocket < 2) {
      if ((pQVar2->super_QSocks5Data).authenticator <
          (QSocks5Authenticator *)((ulong)(pQVar2->localAddress).d.d.ptr >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<QSocks5BindData*const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar3 = (piter)emplace_helper<QSocks5BindData*>(this,key,(QSocks5BindData **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_0023c7b8;
    }
    local_28.d = (Data *)pQVar2;
    if (*(int *)&(pQVar2->super_QSocks5Data).controlSocket != -1) {
      LOCK();
      *(int *)&(pQVar2->super_QSocks5Data).controlSocket =
           *(int *)&(pQVar2->super_QSocks5Data).controlSocket + 1;
      UNLOCK();
      pQVar2 = *(QSocks5BindData **)this;
      if (pQVar2 == (QSocks5BindData *)0x0) goto LAB_0023c72f;
    }
    if (1 < *(uint *)&(pQVar2->super_QSocks5Data).controlSocket) goto LAB_0023c750;
  }
  pVar3 = (piter)emplace_helper<QSocks5BindData*const&>(this,key,args);
  QHash<long_long,_QSocks5BindData_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0023c7b8:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }